

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall CGraphics_Threaded::ScreenshotDirect(CGraphics_Threaded *this,char *pFilename)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  char *format;
  long in_FS_OFFSET;
  png_t Png;
  CScreenshotCommand local_488;
  CImageInfo Image;
  char aBuf [544];
  char aWholePath [512];
  IOHANDLE io;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(&Image,0x18);
  local_488.super_CCommand.m_Cmd = 10;
  local_488.super_CCommand.m_pNext = (CCommand *)0x0;
  local_488.m_X = 0;
  local_488.m_Y = 0;
  local_488.m_W = -1;
  local_488.m_H = -1;
  local_488.m_pImage = &Image;
  CCommandBuffer::AddCommand<CCommandBuffer::CScreenshotCommand>(this->m_pCommandBuffer,&local_488);
  KickCommandBuffer(this);
  (**(code **)(*(long *)this + 0x150))(this);
  if (Image.m_pData != (void *)0x0) {
    iVar2 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                      (this->m_pStorage,pFilename,2,0,aWholePath,0x200,0,0);
    io = (IOHANDLE)CONCAT44(extraout_var,iVar2);
    if (io == (IOHANDLE)0x0) {
      format = "failed to open file \'%s\'";
    }
    else {
      png_open_write(&Png,(png_write_callback_t)0x0,io);
      png_set_data(&Png,Image.m_Width,Image.m_Height,'\b',2,(uchar *)Image.m_pData);
      io_close(io);
      format = "saved screenshot to \'%s\'";
      pFilename = aWholePath;
    }
    str_format(aBuf,0x220,format,pFilename);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,0,"client/screenshot",aBuf,0);
    mem_free(Image.m_pData);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::ScreenshotDirect(const char *pFilename)
{
	// add swap command
	CImageInfo Image;
	mem_zero(&Image, sizeof(Image));

	CCommandBuffer::CScreenshotCommand Cmd;
	Cmd.m_pImage = &Image;
	Cmd.m_X = 0; Cmd.m_Y = 0;
	Cmd.m_W = -1; Cmd.m_H = -1;
	m_pCommandBuffer->AddCommand(Cmd);

	// kick the buffer and wait for the result
	KickCommandBuffer();
	WaitForIdle();

	if(Image.m_pData)
	{
		// find filename
		char aWholePath[IO_MAX_PATH_LENGTH];
		char aBuf[IO_MAX_PATH_LENGTH+32];
		IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE, aWholePath, sizeof(aWholePath));
		if(File)
		{
			// save png
			png_t Png; // ignore_convention
			png_open_write(&Png, 0, File); // ignore_convention
			png_set_data(&Png, Image.m_Width, Image.m_Height, 8, PNG_TRUECOLOR, (unsigned char *)Image.m_pData); // ignore_convention
			io_close(File);
			str_format(aBuf, sizeof(aBuf), "saved screenshot to '%s'", aWholePath);
		}
		else
		{
			str_format(aBuf, sizeof(aBuf), "failed to open file '%s'", pFilename);
		}
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/screenshot", aBuf);
		mem_free(Image.m_pData);
	}
}